

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.h
# Opt level: O2

size_t __thiscall
slang::hash<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_void>::operator()
          (hash<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_void> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *v)

{
  pointer puVar1;
  pointer v_00;
  size_t seed;
  size_t local_20;
  
  local_20 = 0;
  puVar1 = (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (v_00 = (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start; v_00 != puVar1; v_00 = v_00 + 1) {
    hash_combine<unsigned_int>(&local_20,v_00);
  }
  return local_20;
}

Assistant:

size_t operator()(std::vector<T> const& v) const noexcept {
        size_t seed = 0;
        for (const auto& elem : v)
            hash_combine(seed, elem);
        return seed;
    }